

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O1

bool __thiscall
Lib::DArray<Lib::ArrayMapEntry<Kernel::TermList>_>::ensure
          (DArray<Lib::ArrayMapEntry<Kernel::TermList>_> *this,size_t s)

{
  ulong uVar1;
  ArrayMapEntry<Kernel::TermList> *p;
  ArrayMapEntry<Kernel::TermList> *pAVar2;
  ArrayMapEntry<Kernel::TermList> *pAVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ArrayMapEntry<Kernel::TermList> *res;
  
  uVar1 = this->_capacity;
  if (uVar1 < s) {
    uVar6 = uVar1 * 2;
    if (uVar1 * 2 <= s) {
      uVar6 = s;
    }
    uVar5 = uVar6 << 4;
    uVar4 = uVar6;
    if (uVar5 == 0) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<8UL>::alloc
                         ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
      pAVar3 = pAVar2;
    }
    else if (uVar5 < 0x11) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      pAVar3 = pAVar2;
    }
    else if (uVar5 < 0x19) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<24UL>::alloc
                         ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
      pAVar3 = pAVar2;
    }
    else if (uVar5 < 0x21) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<32UL>::alloc
                         ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      pAVar3 = pAVar2;
    }
    else if (uVar5 < 0x31) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<48UL>::alloc
                         ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      pAVar3 = pAVar2;
    }
    else if (uVar5 < 0x41) {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)
               FixedSizeAllocator<64UL>::alloc
                         ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      pAVar3 = pAVar2;
    }
    else {
      pAVar2 = (ArrayMapEntry<Kernel::TermList> *)::operator_new(uVar5,0x10);
      pAVar3 = pAVar2;
    }
    do {
      (pAVar2->_obj)._content = 2;
      pAVar2->_timestamp = 0;
      pAVar2 = pAVar2 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    pAVar2 = this->_array;
    if (pAVar2 != (ArrayMapEntry<Kernel::TermList> *)0x0) {
      uVar4 = this->_capacity << 4;
      if (uVar4 == 0) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pAVar2;
      }
      else if (uVar4 < 0x11) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pAVar2;
      }
      else if (uVar4 < 0x19) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pAVar2;
      }
      else if (uVar4 < 0x21) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pAVar2;
      }
      else if (uVar4 < 0x31) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pAVar2;
      }
      else if (uVar4 < 0x41) {
        (pAVar2->_obj)._content = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pAVar2;
      }
      else {
        operator_delete(pAVar2,0x10);
      }
    }
    this->_size = s;
    this->_capacity = uVar6;
    this->_array = pAVar3;
  }
  else {
    this->_size = s;
  }
  return s <= uVar1;
}

Assistant:

inline bool ensure(size_t s)
  {
    if (_capacity >= s) {
      _size = s;
      return true;
    }

    size_t newCapacity = std::max(s, _capacity*2);

    void* mem = ALLOC_KNOWN(sizeof(C)*newCapacity,"DArray<>");
    C* newArray=array_new<C>(mem, newCapacity);

    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
    _size = s;
    _capacity = newCapacity;
    _array = newArray;
    return false;
  }